

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

string * sqlite_orm::internal::to_string_abi_cxx11_(journal_mode j)

{
  int iVar1;
  
  if (to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_);
    if (iVar1 != 0) {
      to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_[0]._M_dataplus._M_p =
           (pointer)&to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_,"DELETE",
                 "");
      to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_[1]._M_dataplus._M_p =
           (pointer)&to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_[1].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_ + 1),
                 "TRUNCATE","");
      to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_[2]._M_dataplus._M_p =
           (pointer)&to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_[2].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_ + 2),
                 "PERSIST","");
      to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_[3]._M_dataplus._M_p =
           (pointer)&to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_[3].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_ + 3),
                 "MEMORY","");
      to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_[4]._M_dataplus._M_p =
           (pointer)&to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_[4].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_ + 4),
                 "WAL","");
      to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_[5]._M_dataplus._M_p =
           (pointer)&to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_[5].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_ + 5),
                 "OFF","");
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_);
    }
  }
  return to_string[abi:cxx11](sqlite_orm::journal_mode)::res_abi_cxx11_ + (char)j;
}

Assistant:

inline const std::string &to_string(journal_mode j) {
    static std::string res[] = {
        "DELETE",
        "TRUNCATE",
        "PERSIST",
        "MEMORY",
        "WAL",
        "OFF",
    };
    return res[static_cast<int>(j)];
}